

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplaceRealloc<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *this,
          pointer pos,ValueSymbol **args,Symbol **args_1)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppVar4;
  long lVar5;
  pointer ppVar6;
  iterator ppVar7;
  Symbol **in_RCX;
  ValueSymbol **in_RDX;
  iterator in_RSI;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *in_stack_ffffffffffffff90;
  pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*> *in_stack_ffffffffffffff98;
  size_type in_stack_ffffffffffffffa0;
  iterator __first;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
  *in_stack_ffffffffffffffa8;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::max_size
                    ((SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                      *)0x520ab0);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::
          calculateGrowth(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  __first = in_RSI;
  ppVar4 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::begin
                     (in_RDI);
  lVar5 = (long)__first - (long)ppVar4;
  ppVar6 = (pointer)operator_new(0x520b0f);
  std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>::
  pair<slang::ast::ValueSymbol_*,_const_slang::ast::Symbol_*&,_true>
            (ppVar6 + (lVar5 >> 4),in_RDX,in_RCX);
  ppVar4 = in_RSI;
  ppVar7 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end
                     (in_RDI);
  if (ppVar4 == ppVar7) {
    ppVar7 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::begin
                       (in_RDI);
    ppVar4 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end
                       (in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*,std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*>
              (__first,ppVar7,in_stack_ffffffffffffff90);
  }
  else {
    SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::begin(in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*,std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*>
              (__first,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ppVar4 = SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::end
                       (in_RDI);
    std::
    uninitialized_move<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*,std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>*>
              (__first,in_stack_ffffffffffffff98,in_RSI);
  }
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>::cleanup
            (in_RDI,(EVP_PKEY_CTX *)ppVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppVar6;
  return ppVar6 + (lVar5 >> 4);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}